

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipoint-counter.cpp
# Opt level: O3

void __thiscall mahjong::MinipointCounter::computeMelds(MinipointCounter *this)

{
  pointer pMVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  pointer __x;
  Meld it;
  Meld local_50;
  
  __x = (this->hand->melds).super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
        _M_impl.super__Vector_impl_data._M_start;
  pMVar1 = (this->hand->melds).super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (__x != pMVar1) {
    do {
      std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::vector
                (&local_50.tiles,&__x->tiles);
      local_50.is_open = __x->is_open;
      bVar2 = Meld::isTripletOrQuad(&local_50);
      if (bVar2) {
        bVar2 = Meld::isHonors(&local_50);
        if (bVar2) {
LAB_00196d7f:
          iVar5 = 4;
        }
        else {
          bVar2 = Meld::isTerminals(&local_50);
          iVar5 = 2;
          if (bVar2) goto LAB_00196d7f;
        }
        bVar2 = Meld::isOpen(&local_50);
        bVar3 = Meld::isQuad(&local_50);
        iVar4 = (iVar5 << !bVar2) * 4;
        if (!bVar3) {
          iVar4 = iVar5 << !bVar2;
        }
        this->point = this->point + iVar4;
      }
      if (local_50.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.tiles.
                        super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_50.tiles.
                              super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.tiles.
                              super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      __x = __x + 1;
    } while (__x != pMVar1);
  }
  return;
}

Assistant:

void MinipointCounter::computeMelds()
{
	for (auto it : hand.melds)
	{
		if (it.isTripletOrQuad())
		{
			auto basic = 2;

			if (it.isHonors() || it.isTerminals())
			{
				basic *= 2;
			}

			if (!it.isOpen())
			{
				basic *= 2;
			}

			if (it.isQuad())
			{
				basic *= 4;
			}

			point += basic;
		}
	}
}